

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O2

void __thiscall
deqp::gls::StateChangePerformanceCase::requireSamplers(StateChangePerformanceCase *this,int count)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLuint sampler;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  if ((int)((ulong)((long)(this->m_samplers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->m_samplers).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < count) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this->m_samplers,(long)count)
    ;
    while ((int)((ulong)((long)(this->m_samplers).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_samplers).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2) < count) {
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6f0))(1,&sampler);
      err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
      glu::checkError(err,"glGenSamplers()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x1c8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_samplers,&sampler);
    }
  }
  return;
}

Assistant:

void StateChangePerformanceCase::requireSamplers (int count)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if ((int)m_samplers.size() >= count)
		return;

	m_samplers.reserve(count);

	while ((int)m_samplers.size() < count)
	{
		GLuint sampler;
		gl.genSamplers(1, &sampler);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenSamplers()");
		m_samplers.push_back(sampler);
	}
}